

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O3

void __thiscall OpenMD::Shake::Shake(Shake *this,SimInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SimInfo *pSVar2;
  Globals *pGVar3;
  pointer pcVar4;
  Parameter<double> *pPVar5;
  long *plVar6;
  ConstraintWriter *this_00;
  size_type *psVar7;
  string local_90;
  string local_70;
  string local_50;
  
  this->info_ = info;
  this->maxConsIteration_ = 10;
  this->consTolerance_ = 1e-06;
  this->doShake_ = false;
  (this->constraintOutputFile_)._M_dataplus._M_p = (pointer)&(this->constraintOutputFile_).field_2;
  (this->constraintOutputFile_)._M_string_length = 0;
  (this->constraintOutputFile_).field_2._M_local_buf[0] = '\0';
  this->currConstraintTime_ = 0.0;
  if (info->hasNGlobalConstraints_ == false) {
    SimInfo::calcNConstraints(info);
  }
  if (info->nGlobalConstraints_ == 0) {
    if ((this->doShake_ & 1U) == 0) {
      return;
    }
  }
  else {
    this->doShake_ = true;
  }
  pSVar2 = this->info_;
  pGVar3 = pSVar2->simParams_;
  this->currentSnapshot_ = pSVar2->sman_->currentSnapshot_;
  pPVar5 = &pGVar3->ConstraintTime;
  if ((pGVar3->ConstraintTime).super_ParameterBase.empty_ != false) {
    pPVar5 = &pGVar3->StatusTime;
  }
  this->constraintTime_ = pPVar5->data_;
  pcVar4 = (pSVar2->finalConfigFileName_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + (pSVar2->finalConfigFileName_)._M_string_length);
  getPrefix(&local_50,&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  paVar1 = &local_90.field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_8_ = plVar6[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_90._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->constraintOutputFile_,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this_00 = (ConstraintWriter *)operator_new(0x208);
  pSVar2 = this->info_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,(this->constraintOutputFile_)._M_dataplus._M_p,
             (allocator<char> *)&local_50);
  ConstraintWriter::ConstraintWriter(this_00,pSVar2,&local_90);
  this->constraintWriter_ = this_00;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_90._M_dataplus._M_p != paVar1) &&
     (operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1),
     this->constraintWriter_ == (ConstraintWriter *)0x0)) {
    builtin_strncpy(painCave.errMsg,"Failed to create ConstraintWriter\n",0x23);
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

Shake::Shake(SimInfo* info) :
      info_(info), maxConsIteration_(10), consTolerance_(1.0e-6),
      doShake_(false), currConstraintTime_(0.0) {
    if (info_->getNGlobalConstraints() > 0) doShake_ = true;

    if (!doShake_) return;

    Globals* simParams = info_->getSimParams();

    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (simParams->haveConstraintTime()) {
      constraintTime_ = simParams->getConstraintTime();
    } else {
      constraintTime_ = simParams->getStatusTime();
    }

    constraintOutputFile_ =
        getPrefix(info_->getFinalConfigFileName()) + ".constraintForces";

    // create ConstraintWriter
    constraintWriter_ =
        new ConstraintWriter(info_, constraintOutputFile_.c_str());

    if (!constraintWriter_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Failed to create ConstraintWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }